

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O3

optional<uuids::uuid> * __thiscall
uuids::uuid::from_string<wchar_t_const*>
          (optional<uuids::uuid> *__return_storage_ptr__,uuid *this,wchar_t **in_str)

{
  uint uVar1;
  uint uVar2;
  wchar_t wVar3;
  wchar_t *__s;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 local_28;
  undefined8 uStack_20;
  
  __s = *(wchar_t **)(this->data)._M_elems;
  if (__s != (wchar_t *)0x0) {
    sVar5 = wcslen(__s);
    local_28 = 0;
    uStack_20 = 0;
    if ((sVar5 != 0) &&
       (((bVar13 = *__s == L'{', !bVar13 || (__s[sVar5 - 1] == L'}')) &&
        (uVar6 = (ulong)bVar13, uVar6 < sVar5 - uVar6)))) {
      bVar4 = true;
      lVar7 = 0;
      uVar8 = 0;
      do {
        wVar3 = __s[uVar6 + lVar7];
        if (wVar3 != L'-') {
          if (0xf < uVar8) goto LAB_00171e41;
          uVar1 = wVar3 + L'\xffffffd0';
          cVar9 = (char)wVar3;
          if (uVar1 < 10) {
            if (bVar4) {
LAB_00171dc8:
              cVar9 = cVar9 + -0x30;
LAB_00171dcc:
              *(char *)((long)&local_28 + uVar8) = cVar9 << 4;
              bVar4 = false;
              goto LAB_00171df3;
            }
            bVar11 = *(byte *)((long)&local_28 + uVar8);
LAB_00171de2:
            bVar10 = cVar9 - 0x30;
          }
          else {
            bVar12 = false;
            uVar2 = wVar3 + L'\xffffffbf';
            if ((0x25 < uVar2) || ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0))
            goto LAB_00171e44;
            if (bVar4) {
              if (uVar1 < 10) goto LAB_00171dc8;
              if ((uint)(wVar3 + L'\xffffff9f') < 6) {
                cVar9 = cVar9 + -0x57;
              }
              else if (uVar2 < 6) {
                cVar9 = cVar9 + -0x37;
              }
              else {
                cVar9 = '\0';
              }
              goto LAB_00171dcc;
            }
            bVar11 = *(byte *)((long)&local_28 + uVar8);
            if (uVar1 < 10) goto LAB_00171de2;
            if ((uint)(wVar3 + L'\xffffff9f') < 6) {
              bVar10 = cVar9 + 0xa9;
            }
            else if (uVar2 < 6) {
              bVar10 = cVar9 - 0x37;
            }
            else {
              bVar10 = 0;
            }
          }
          *(byte *)((long)&local_28 + uVar8) = bVar11 | bVar10;
          uVar8 = uVar8 + 1;
          bVar4 = true;
        }
LAB_00171df3:
        lVar7 = lVar7 + 1;
      } while (sVar5 - (uint)bVar13 * 2 != lVar7);
      if (0xf < uVar8) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
          super__Optional_payload_base<uuids::uuid>._M_payload = local_28;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
                 super__Optional_payload_base<uuids::uuid>._M_payload + 8) = uStack_20;
        bVar12 = true;
        goto LAB_00171e44;
      }
    }
  }
LAB_00171e41:
  bVar12 = false;
LAB_00171e44:
  (__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
  super__Optional_payload_base<uuids::uuid>._M_engaged = bVar12;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr static std::optional<uuid> from_string(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         std::array<uint8_t, 16> data{ { 0 } };

         if (str.empty()) return {};

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return {};

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return {};
            }

            if (firstDigit)
            {
               data[index] = static_cast<uint8_t>(detail::hex2char(str[i]) << 4);
               firstDigit = false;
            }
            else
            {
               data[index] = static_cast<uint8_t>(data[index] | detail::hex2char(str[i]));
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return {};
         }

         return uuid{ data };
      }